

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,
          small_vector<int,_4UL,_0UL,_std::allocator<int>_> *v)

{
  type *ptVar1;
  type *ptVar2;
  type *ptVar3;
  
  this->m_capacity = v->m_capacity;
  this->m_dynamic_capacity = v->m_dynamic_capacity;
  this->m_dynamic_data = v->m_dynamic_data;
  ptVar1 = v->m_static_data;
  if ((type *)v->m_begin == ptVar1) {
    this->m_end = (pointer)this->m_static_data;
    this->m_begin = (pointer)this->m_static_data;
    ptVar3 = this->m_static_data;
    for (ptVar2 = (type *)v->m_begin; ptVar3 = ptVar3 + 1, ptVar2 != (type *)v->m_end;
        ptVar2 = ptVar2 + 1) {
      ptVar3[-1] = *ptVar2;
      this->m_end = (pointer)ptVar3;
    }
  }
  else {
    this->m_begin = v->m_begin;
    this->m_end = v->m_end;
  }
  v->m_dynamic_capacity = 0;
  v->m_dynamic_data = (pointer)0x0;
  v->m_end = (pointer)ptVar1;
  v->m_begin = (pointer)ptVar1;
  v->m_capacity = 4;
  return;
}

Assistant:

small_vector(small_vector&& v) noexcept
        : m_alloc(std::move(v.get_alloc()))
        , m_capacity(v.m_capacity)
        , m_dynamic_capacity(v.m_dynamic_capacity)
        , m_dynamic_data(v.m_dynamic_data)
    {
        if (v.m_begin == v.static_begin_ptr())
        {
            m_begin = m_end = static_begin_ptr();
            for (auto p = v.m_begin; p != v.m_end; ++p)
            {
                atraits::construct(get_alloc(), m_end, std::move(*p));
                ++m_end;
            }

            v.clear();
        }
        else
        {
            m_begin = v.m_begin;
            m_end = v.m_end;
        }

        v.m_dynamic_capacity = 0;
        v.m_dynamic_data = nullptr;
        v.m_begin = v.m_end = v.static_begin_ptr();
        v.m_capacity = StaticCapacity;
    }